

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int parse_asn1_tag(CBS *cbs,CBS_ASN1_TAG *out)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint64_t in_RAX;
  uint uVar4;
  uint64_t v;
  
  iVar3 = 0;
  if (cbs->len != 0) {
    pbVar2 = cbs->data;
    cbs->data = pbVar2 + 1;
    cbs->len = cbs->len - 1;
    bVar1 = *pbVar2;
    uVar4 = bVar1 & 0x1f;
    v = (uint64_t)uVar4;
    if ((uVar4 == 0x1f) &&
       (v = in_RAX, iVar3 = parse_base128_integer(cbs,&v),
       (v - 0x1f < 0x1fffffe1 & (byte)iVar3) != 1)) {
      return 0;
    }
    uVar4 = (bVar1 & 0xffffffe0) << 0x18 | (uint)v;
    iVar3 = 0;
    if ((uVar4 & 0xdfffffff) != 0) {
      *out = uVar4;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}